

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcess.cpp
# Opt level: O2

void __thiscall MultiAgentDecisionProcess::InitializeUnixName(MultiAgentDecisionProcess *this)

{
  string unixName;
  string local_40 [32];
  
  std::__cxx11::string::rfind((char)&this->_m_problemFile,0x2f);
  std::__cxx11::string::substr((ulong)&unixName,(ulong)&this->_m_problemFile);
  std::__cxx11::string::rfind((char)&unixName,0x2e);
  std::__cxx11::string::substr((ulong)local_40,(ulong)&unixName);
  std::__cxx11::string::operator=((string *)&this->_m_unixName,local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string((string *)&unixName);
  return;
}

Assistant:

void MultiAgentDecisionProcess::InitializeUnixName()
{
    // strip everything before and including the last /
    string unixName=_m_problemFile.substr(_m_problemFile.find_last_of('/') + 1);

    // and after the last .
    _m_unixName=unixName.substr(0,unixName.find_last_of('.'));
}